

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O2

void appendOrganizationAndApp(QString *path)

{
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_const_QString_&> local_68;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCoreApplication::organizationName();
  if ((undefined1 *)local_38.size != (undefined1 *)0x0) {
    local_58.d = (Data *)CONCAT62(local_58.d._2_6_,0x2f);
    local_58.ptr = (char16_t *)&local_38;
    operator+=(path,(QStringBuilder<char16_t,_const_QString_&> *)&local_58);
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCoreApplication::applicationName();
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    local_68.a = L'/';
    local_68.b = (QString *)&local_58;
    operator+=(path,&local_68);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void appendOrganizationAndApp(QString &path)
{
#ifndef QT_BOOTSTRAPPED
    const QString org = QCoreApplication::organizationName();
    if (!org.isEmpty())
        path += u'/' + org;
    const QString appName = QCoreApplication::applicationName();
    if (!appName.isEmpty())
        path += u'/' + appName;
#else
    Q_UNUSED(path);
#endif
}